

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_scientific.cpp
# Opt level: O0

bool __thiscall
icu_63::numparse::impl::ScientificMatcher::match
          (ScientificMatcher *this,StringSegment *segment,ParsedNumber *result,UErrorCode *status)

{
  bool bVar1;
  int32_t delta;
  int32_t iVar2;
  int32_t iVar3;
  UnicodeSet *pUVar4;
  bool digitsReturnValue;
  int digitsOffset;
  bool wasBogus;
  int32_t overlap2_1;
  int32_t overlap2;
  int8_t exponentSign;
  int overlap1;
  UErrorCode *status_local;
  ParsedNumber *result_local;
  StringSegment *segment_local;
  ScientificMatcher *this_local;
  
  bVar1 = ParsedNumber::seenNumber(result);
  if (bVar1) {
    if ((result->flags & 8U) == 0) {
      delta = StringSegment::getCommonPrefixLength(segment,&this->fExponentSeparatorString);
      iVar2 = icu_63::UnicodeString::length(&this->fExponentSeparatorString);
      if (delta == iVar2) {
        iVar2 = StringSegment::length(segment);
        if (iVar2 == delta) {
          this_local._7_1_ = true;
        }
        else {
          StringSegment::adjustOffset(segment,delta);
          overlap2_1._3_1_ = '\x01';
          pUVar4 = anon_unknown.dwarf_22b276::minusSignSet();
          bVar1 = StringSegment::startsWith(segment,pUVar4);
          if (bVar1) {
            overlap2_1._3_1_ = -1;
            StringSegment::adjustOffsetByCodePoint(segment);
          }
          else {
            pUVar4 = anon_unknown.dwarf_22b276::plusSignSet();
            bVar1 = StringSegment::startsWith(segment,pUVar4);
            if (bVar1) {
              StringSegment::adjustOffsetByCodePoint(segment);
            }
            else {
              bVar1 = StringSegment::startsWith(segment,&this->fCustomMinusSign);
              if (bVar1) {
                iVar2 = StringSegment::getCommonPrefixLength(segment,&this->fCustomMinusSign);
                iVar3 = icu_63::UnicodeString::length(&this->fCustomMinusSign);
                if (iVar2 != iVar3) {
                  StringSegment::adjustOffset(segment,-delta);
                  return true;
                }
                overlap2_1._3_1_ = -1;
                StringSegment::adjustOffset(segment,iVar2);
              }
              else {
                bVar1 = StringSegment::startsWith(segment,&this->fCustomPlusSign);
                if (bVar1) {
                  iVar2 = StringSegment::getCommonPrefixLength(segment,&this->fCustomPlusSign);
                  iVar3 = icu_63::UnicodeString::length(&this->fCustomPlusSign);
                  if (iVar2 != iVar3) {
                    StringSegment::adjustOffset(segment,-delta);
                    return true;
                  }
                  StringSegment::adjustOffset(segment,iVar2);
                }
              }
            }
          }
          bVar1 = (result->quantity).bogus;
          (result->quantity).bogus = false;
          iVar2 = StringSegment::getOffset(segment);
          this_local._7_1_ =
               DecimalMatcher::match(&this->fExponentMatcher,segment,result,overlap2_1._3_1_,status)
          ;
          (result->quantity).bogus = (bool)(bVar1 & 1);
          iVar3 = StringSegment::getOffset(segment);
          if (iVar3 == iVar2) {
            StringSegment::adjustOffset(segment,-delta);
          }
          else {
            result->flags = result->flags | 8;
          }
        }
      }
      else {
        iVar2 = StringSegment::length(segment);
        if (delta == iVar2) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ScientificMatcher::match(StringSegment& segment, ParsedNumber& result, UErrorCode& status) const {
    // Only accept scientific notation after the mantissa.
    if (!result.seenNumber()) {
        return false;
    }

    // Only accept one exponent per string.
    if (0 != (result.flags & FLAG_HAS_EXPONENT)) {
        return false;
    }

    // First match the scientific separator, and then match another number after it.
    // NOTE: This is guarded by the smoke test; no need to check fExponentSeparatorString length again.
    int overlap1 = segment.getCommonPrefixLength(fExponentSeparatorString);
    if (overlap1 == fExponentSeparatorString.length()) {
        // Full exponent separator match.

        // First attempt to get a code point, returning true if we can't get one.
        if (segment.length() == overlap1) {
            return true;
        }
        segment.adjustOffset(overlap1);

        // Allow a sign, and then try to match digits.
        int8_t exponentSign = 1;
        if (segment.startsWith(minusSignSet())) {
            exponentSign = -1;
            segment.adjustOffsetByCodePoint();
        } else if (segment.startsWith(plusSignSet())) {
            segment.adjustOffsetByCodePoint();
        } else if (segment.startsWith(fCustomMinusSign)) {
            // Note: call site is guarded with startsWith, which returns false on empty string
            int32_t overlap2 = segment.getCommonPrefixLength(fCustomMinusSign);
            if (overlap2 != fCustomMinusSign.length()) {
                // Partial custom sign match; un-match the exponent separator.
                segment.adjustOffset(-overlap1);
                return true;
            }
            exponentSign = -1;
            segment.adjustOffset(overlap2);
        } else if (segment.startsWith(fCustomPlusSign)) {
            // Note: call site is guarded with startsWith, which returns false on empty string
            int32_t overlap2 = segment.getCommonPrefixLength(fCustomPlusSign);
            if (overlap2 != fCustomPlusSign.length()) {
                // Partial custom sign match; un-match the exponent separator.
                segment.adjustOffset(-overlap1);
                return true;
            }
            segment.adjustOffset(overlap2);
        }

        // We are supposed to accept E0 after NaN, so we need to make sure result.quantity is available.
        bool wasBogus = result.quantity.bogus;
        result.quantity.bogus = false;
        int digitsOffset = segment.getOffset();
        bool digitsReturnValue = fExponentMatcher.match(segment, result, exponentSign, status);
        result.quantity.bogus = wasBogus;

        if (segment.getOffset() != digitsOffset) {
            // At least one exponent digit was matched.
            result.flags |= FLAG_HAS_EXPONENT;
        } else {
            // No exponent digits were matched; un-match the exponent separator.
            segment.adjustOffset(-overlap1);
        }
        return digitsReturnValue;

    } else if (overlap1 == segment.length()) {
        // Partial exponent separator match
        return true;
    }

    // No match
    return false;
}